

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timestamp.cpp
# Opt level: O0

TimestampCastResult
duckdb::Timestamp::TryConvertTimestamp
          (char *str,idx_t len,timestamp_t *result,optional_ptr<int,_true> nanos,bool strict)

{
  idx_t iVar1;
  char *pcVar2;
  string_t *in_RCX;
  undefined1 in_R8B;
  char *tz_ptr;
  TimestampCastResult success;
  bool has_offset;
  string_t tz;
  string_t *in_stack_00000060;
  bool *in_stack_00000068;
  timestamp_t *in_stack_00000070;
  idx_t in_stack_00000078;
  char *in_stack_00000080;
  optional_ptr<int,_true> in_stack_00000088;
  undefined4 in_stack_ffffffffffffffc4;
  undefined8 in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  TimestampCastResult local_1;
  
  string_t::string_t((string_t *)(CONCAT17(in_R8B,in_stack_ffffffffffffffd0) & 0x1ffffffffffffff),
                     (char *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
  local_1 = TryConvertTimestampTZ
                      (in_stack_00000080,in_stack_00000078,in_stack_00000070,in_stack_00000068,
                       in_stack_00000060,in_stack_00000088);
  if (local_1 == SUCCESS) {
    iVar1 = string_t::GetSize((string_t *)&stack0xffffffffffffffc0);
    if (iVar1 == 0) {
      local_1 = SUCCESS;
    }
    else {
      iVar1 = string_t::GetSize((string_t *)&stack0xffffffffffffffc0);
      if ((((iVar1 == 3) &&
           ((pcVar2 = string_t::GetData(in_RCX), *pcVar2 == 'u' || (*pcVar2 == 'U')))) &&
          ((pcVar2[1] == 't' || (pcVar2[1] == 'T')))) && ((pcVar2[2] == 'c' || (pcVar2[2] == 'C'))))
      {
        local_1 = SUCCESS;
      }
      else {
        local_1 = ERROR_NON_UTC_TIMEZONE;
      }
    }
  }
  return local_1;
}

Assistant:

TimestampCastResult Timestamp::TryConvertTimestamp(const char *str, idx_t len, timestamp_t &result,
                                                   optional_ptr<int32_t> nanos, bool strict) {
	string_t tz(nullptr, 0);
	bool has_offset = false;
	// We don't understand TZ without an extension, so fail if one was provided.
	auto success = TryConvertTimestampTZ(str, len, result, has_offset, tz, nanos);
	if (success != TimestampCastResult::SUCCESS) {
		return success;
	}
	if (tz.GetSize() == 0) {
		// no timezone provided - success!
		if (strict && has_offset) {
			return TimestampCastResult::STRICT_UTC;
		}
		return TimestampCastResult::SUCCESS;
	}
	if (tz.GetSize() == 3) {
		// we can ONLY handle UTC without ICU being loaded
		auto tz_ptr = tz.GetData();
		if ((tz_ptr[0] == 'u' || tz_ptr[0] == 'U') && (tz_ptr[1] == 't' || tz_ptr[1] == 'T') &&
		    (tz_ptr[2] == 'c' || tz_ptr[2] == 'C')) {
			if (strict && has_offset) {
				return TimestampCastResult::STRICT_UTC;
			}
			return TimestampCastResult::SUCCESS;
		}
	}
	return TimestampCastResult::ERROR_NON_UTC_TIMEZONE;
}